

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

FiniteAutomaton *
Omega_h::FiniteAutomaton::unite
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,FiniteAutomaton *b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int at_symbol;
  int at_symbol_00;
  
  iVar4 = (a->table).ncols;
  bVar1 = a->is_deterministic;
  iVar2 = get_nrows<int>(&a->table);
  iVar3 = get_nrows<int>(&b->table);
  FiniteAutomaton(__return_storage_ptr__,iVar4 + (uint)bVar1 * 2 + -2,false,iVar2 + iVar3 + 1);
  iVar4 = add_state(__return_storage_ptr__);
  iVar2 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,a);
  iVar3 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,b);
  at_symbol = get_epsilon0(__return_storage_ptr__);
  at_symbol_00 = get_epsilon1(__return_storage_ptr__);
  add_transition(__return_storage_ptr__,iVar4,at_symbol,iVar2);
  add_transition(__return_storage_ptr__,iVar4,at_symbol_00,iVar3);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::unite(
    FiniteAutomaton const& a, FiniteAutomaton const& b) {
  auto nsymbols = get_nsymbols(a);
  FiniteAutomaton out(nsymbols, false, 1 + get_nstates(a) + get_nstates(b));
  auto start_state = add_state(out);
  auto a_offset = get_nstates(out);
  append_states(out, a);
  auto b_offset = get_nstates(out);
  append_states(out, b);
  auto epsilon0 = get_epsilon0(out);
  auto epsilon1 = get_epsilon1(out);
  add_transition(out, start_state, epsilon0, a_offset);
  add_transition(out, start_state, epsilon1, b_offset);
  return out;
}